

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcessEnvironment::contains(QProcessEnvironment *this,QString *name)

{
  bool bVar1;
  QProcessEnvironmentPrivate *pQVar2;
  QProcessEnvironmentPrivate *in_RSI;
  long in_FS_OFFSET;
  Map *key;
  QMap<QByteArray,_QProcEnvValue> *this_00;
  QString *in_stack_ffffffffffffffc0;
  bool local_21;
  QMap<QByteArray,_QProcEnvValue> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator!
                    ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78efbf);
  if (bVar1) {
    local_21 = false;
  }
  else {
    pQVar2 = QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
                       ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78efd6);
    key = &pQVar2->vars;
    QSharedDataPointer<QProcessEnvironmentPrivate>::operator->
              ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78efe9);
    this_00 = local_20;
    QProcessEnvironmentPrivate::prepareName(in_RSI,in_stack_ffffffffffffffc0);
    local_21 = QMap<QByteArray,_QProcEnvValue>::contains(this_00,(QByteArray *)key);
    QByteArray::~QByteArray((QByteArray *)0x78f029);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessEnvironment::contains(const QString &name) const
{
    if (!d)
        return false;
    return d->vars.contains(d->prepareName(name));
}